

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O1

int BN_mul_word(BIGNUM *a,ulong w)

{
  int iVar1;
  ulong uVar2;
  BIGNUM *pBVar3;
  int iVar4;
  
  iVar4 = 1;
  if (a->top != 0) {
    if (w == 0) {
      BN_zero_ex((BIGNUM *)a);
    }
    else {
      uVar2 = bn_mul_words(a->d,a->d,a->top,w);
      if (uVar2 != 0) {
        pBVar3 = bn_wexpand((BIGNUM *)a,a->top + 1);
        if (pBVar3 == (BIGNUM *)0x0) {
          iVar4 = 0;
        }
        else {
          iVar1 = a->top;
          a->top = iVar1 + 1;
          a->d[iVar1] = uVar2;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int BN_mul_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG ll;

    bn_check_top(a);
    w &= BN_MASK2;
    if (a->top) {
        if (w == 0)
            BN_zero(a);
        else {
            ll = bn_mul_words(a->d, a->d, a->top, w);
            if (ll) {
                if (bn_wexpand(a, a->top + 1) == NULL)
                    return (0);
                a->d[a->top++] = ll;
            }
        }
    }
    bn_check_top(a);
    return (1);
}